

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,long>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  undefined8 *puVar8;
  string_t new_value;
  SelectionVector sel;
  LogicalType local_21f8 [24];
  UnifiedVectorFormat sdata;
  long local_21d8;
  UnifiedVectorFormat bdata;
  long local_2190;
  long local_2188;
  UnifiedVectorFormat adata;
  long local_2140;
  Vector sort_key;
  long local_20e8;
  Vector sliced_input;
  sel_t assign_sel [2048];
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&adata);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
  duckdb::Vector::ToUnifiedFormat((ulong)(inputs + 0x68),(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  uVar4 = 0;
  pcVar7 = (char *)0x0;
  for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
    uVar2 = uVar6;
    if (*_bdata != 0) {
      uVar2 = (ulong)*(uint *)(*_bdata + uVar6 * 4);
    }
    if ((local_2188 == 0) ||
       ((*(ulong *)(local_2188 + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) != 0)) {
      uVar5 = uVar6;
      if (*_adata != 0) {
        uVar5 = (ulong)*(uint *)(*_adata + uVar6 * 4);
      }
      lVar3 = *(long *)(local_2190 + uVar2 * 8);
      if ((local_2140 == 0) ||
         ((*(ulong *)(local_2140 + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) != 0)) {
        uVar2 = uVar6;
        if (*_sdata != 0) {
          uVar2 = (ulong)*(uint *)(*_sdata + uVar6 * 4);
        }
        pcVar1 = *(char **)(local_21d8 + uVar2 * 8);
        if ((*pcVar1 != '\x01') || (lVar3 < *(long *)(pcVar1 + 0x18))) {
          *(long *)(pcVar1 + 0x18) = lVar3;
          pcVar1[1] = '\0';
          lVar3 = uVar4 - (pcVar1 == pcVar7);
          assign_sel[lVar3] = (sel_t)uVar6;
          uVar4 = lVar3 + 1;
          *pcVar1 = '\x01';
          pcVar7 = pcVar1;
        }
      }
    }
  }
  if (uVar4 != 0) {
    duckdb::LogicalType::LogicalType(local_21f8,BLOB);
    duckdb::Vector::Vector(&sort_key,local_21f8,0x800);
    duckdb::LogicalType::~LogicalType(local_21f8);
    SelectionVector::SelectionVector(&sel,assign_sel);
    duckdb::Vector::Vector(&sliced_input,inputs,&sel,uVar4);
    duckdb::CreateSortKeyHelpers::CreateSortKey(&sliced_input,uVar4,(OrderModifiers)0x302,&sort_key)
    ;
    puVar8 = (undefined8 *)(local_20e8 + 8);
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = uVar6;
      if (sel.sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)sel.sel_vector[uVar6];
      }
      lVar3 = *_sdata;
      if (lVar3 != 0) {
        uVar2 = (ulong)*(uint *)(lVar3 + uVar2 * 4);
      }
      new_value.value.pointer.ptr = (char *)lVar3;
      new_value.value._0_8_ = *puVar8;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)(*(long *)(local_21d8 + uVar2 * 8) + 8),
                 (string_t *)puVar8[-1],new_value);
      puVar8 = puVar8 + 2;
    }
    Vector::~Vector(&sliced_input);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Vector::~Vector(&sort_key);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}